

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayView.hpp
# Opt level: O0

ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
* __thiscall
memory::
ArrayReference<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>
::operator=(ArrayReference<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>
            *this,vector<int,_std::allocator<int>_> *other)

{
  size_type sVar1;
  size_type sVar2;
  const_iterator __first;
  const_iterator __last;
  pointer __result;
  vector<int,_std::allocator<int>_> *other_local;
  ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
  *this_local;
  
  sVar1 = std::vector<int,_std::allocator<int>_>::size(other);
  sVar2 = ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
          ::size((ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
                  *)this);
  if (sVar1 == sVar2) {
    __first = std::vector<int,_std::allocator<int>_>::begin(other);
    __last = std::vector<int,_std::allocator<int>_>::end(other);
    __result = ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
               ::data((ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
                       *)this);
    std::copy<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,int*>
              ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
               __first._M_current,
               (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
               __last._M_current,__result);
    return (ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
            *)this;
  }
  __assert_fail("other.size()==size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/include/ArrayView.hpp"
                ,0x2e7,
                "ArrayReference<T, Coord> &memory::ArrayReference<int, memory::HostCoordinator<int>>::operator=(const std::vector<value_type, Allocator> &) [T = int, Coord = memory::HostCoordinator<int>, Allocator = std::allocator<int>]"
               );
}

Assistant:

ArrayReference& operator=(const std::vector<value_type, Allocator>& other)
    {
        assert(other.size()==size());
#if VERBOSE>1
        std::cerr << util::pretty_printer<ArrayReference>::print(*this)
                  << "::" << util::blue("operator=") << "(std::vector(" << other.size() << "))"
                  << std::endl;
#endif
        // there is a kink in the coordinator, so use std::copy directly, because we know
        // that coordinator_type is_malloc_compatible
        //base::coordinator_.copy(base(other.data(), other.size(), this);
        std::copy(other.begin(), other.end(), base::data());
        return *this;
    }